

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall
CVmConsole::log_event(CVmConsole *this,char *tag,char *param,size_t paramlen,int param_is_utf8)

{
  char cVar1;
  int iVar2;
  long in_RCX;
  char *in_RDX;
  char *in_RSI;
  void *in_RDI;
  int in_R8D;
  void *unaff_retaddr;
  size_t taglen;
  size_t in_stack_000000d0;
  char *in_stack_000000d8;
  CVmDataSource *in_stack_000000e0;
  CCharmapToLocal *in_stack_000000e8;
  size_t local_30;
  long local_20;
  char *local_18;
  void *s2;
  
  if (*(long *)((long)in_RDI + 0x28) != 0) {
    s2 = in_RDI;
    local_30 = strlen(in_RSI);
    if (*in_RSI == '<') {
      in_RSI = in_RSI + 1;
      local_30 = local_30 - 1;
    }
    if ((local_30 != 0) && (in_RSI[local_30 - 1] == '>')) {
      local_30 = local_30 - 1;
    }
    if ((*(byte *)((long)in_RDI + 0x18) >> 2 & 1) == 0) {
      if (((local_30 == 4) && (iVar2 = memicmp(unaff_retaddr,s2,(size_t)in_RSI), iVar2 == 0)) &&
         (in_RDX != (char *)0x0)) {
        CCharmapToLocal::write_file
                  (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
        if (in_R8D == 0) {
          (**(code **)(**(long **)((long)in_RDI + 0x28) + 0x20))
                    (*(long **)((long)in_RDI + 0x28),in_RDX,in_RCX);
        }
        else {
          CCharmapToLocal::write_file
                    (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
        }
        CCharmapToLocal::write_file
                  (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
        (**(code **)(**(long **)((long)in_RDI + 0x28) + 0x48))();
      }
    }
    else {
      local_20 = in_RCX;
      local_18 = in_RDX;
      if (((local_30 == 3) && (iVar2 = memicmp(unaff_retaddr,s2,(size_t)in_RSI), iVar2 == 0)) &&
         ((in_RDX != (char *)0x0 && (in_RCX == 1)))) {
        cVar1 = *in_RDX;
        if (cVar1 == '\t') {
          local_18 = "[tab]";
          local_20 = 5;
        }
        else if (cVar1 == '\n') {
          local_18 = "[enter]";
          local_20 = 7;
        }
        else if (cVar1 == ' ') {
          local_18 = "[space]";
          local_20 = 7;
        }
      }
      if (((local_30 == 9) && (iVar2 = memicmp(unaff_retaddr,s2,(size_t)in_RSI), iVar2 == 0)) ||
         ((local_30 == 3 && (iVar2 = memicmp(unaff_retaddr,s2,(size_t)in_RSI), iVar2 == 0)))) {
        local_18 = (char *)0x0;
      }
      if (local_30 != 0) {
        CCharmapToLocal::write_file
                  (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
        strlen(in_RSI);
        CCharmapToLocal::write_file
                  (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
        CCharmapToLocal::write_file
                  (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
        if (local_18 != (char *)0x0) {
          if (in_R8D == 0) {
            (**(code **)(**(long **)((long)in_RDI + 0x28) + 0x20))
                      (*(long **)((long)in_RDI + 0x28),local_18,local_20);
          }
          else {
            CCharmapToLocal::write_file
                      (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
          }
        }
        CCharmapToLocal::write_file
                  (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
        (**(code **)(**(long **)((long)in_RDI + 0x28) + 0x48))();
      }
    }
  }
  return;
}

Assistant:

void CVmConsole::log_event(VMG_ const char *tag,
                           const char *param, size_t paramlen,
                           int param_is_utf8)
{
    /* if there's a script file, log the event */
    if (command_fp_ != 0)
    {
        /* if the tag has < > delimiters, remove them */
        size_t taglen = strlen(tag);
        if (tag[0] == '<')
            ++tag, --taglen;
        if (taglen != 0 && tag[taglen-1] == '>')
            --taglen;

        /* write the event in the proper format for the script type */
        if (command_eventscript_)
        {
            /* 
             *   It's an event script, so we write all event types.  Check
             *   for certain special parameter translations.  
             */
            if (taglen == 3 && memicmp(tag, "key", 3) == 0)
            {
                /* 
                 *   key event - for characters that would look like
                 *   whitespace characters if we wrote them as-is, translate
                 *   to [xxx] key names 
                 */
                if (param != 0 && paramlen == 1)
                {
                    switch (param[0])
                    {
                    case '\n':
                        param = "[enter]";
                        paramlen = 7;
                        break;

                    case '\t':
                        param = "[tab]";
                        paramlen = 5;
                        break;

                    case ' ':
                        param = "[space]";
                        paramlen = 7;
                        break;
                    }
                }
            }

            /* 
             *   if the event doesn't have parameters, ignore any parameter
             *   provided by the caller 
             */
            if ((taglen == 9 && memicmp(tag, "notimeout", 9) == 0)
                || (taglen == 3 && memicmp(tag, "eof", 3) == 0))
                param = 0;

            /* if we have a non-empty tag, write the event */
            if (taglen != 0)
            {
                /* write the tag, in the local character set */
                G_cmap_to_ui->write_file(command_fp_, "<", 1);
                G_cmap_to_ui->write_file(command_fp_, tag, strlen(tag));
                G_cmap_to_ui->write_file(command_fp_, ">", 1);
                
                /* add the parameter, if present */
                if (param != 0)
                {
                    if (param_is_utf8)
                        G_cmap_to_ui->write_file(command_fp_, param, paramlen);
                    else
                        command_fp_->write(param, paramlen);
                }
                
                /* add the newline */
                G_cmap_to_ui->write_file(command_fp_, "\n", 1);
                
                /* flush the output */
                command_fp_->flush();
            }
        }
        else
        {
            /*
             *   It's a plain old command-line script.  If the event is an
             *   input-line event, record it; otherwise leave it out, as this
             *   script file format can't represent any other event types.  
             */
            if (taglen == 4 && memicmp(tag, "line", 4) == 0 && param != 0)
            {
                /* write the ">" prefix */
                G_cmap_to_ui->write_file(command_fp_, ">", 1);

                /* add the command line */
                if (param_is_utf8)
                    G_cmap_to_ui->write_file(command_fp_, param, paramlen);
                else
                    command_fp_->write(param, paramlen);

                /* add the newline */
                G_cmap_to_ui->write_file(command_fp_, "\n", 1);

                /* flush the output */
                command_fp_->flush();
            }
        }
    }
}